

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

stringstream *
cpsm::str_cat<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ss_00;
  stringstream local_198 [408];
  
  ss_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  str_cat_impl<std::__cxx11::string>((stringstream *)ss_00,in_RDI);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return (stringstream *)ss_00;
}

Assistant:

std::string str_cat(Args... args) {
  std::stringstream ss;
  str_cat_impl(ss, args...);
  return ss.str();
}